

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
           *this,WriteStream *temp_writer,ColumnWriterStatistics *stats,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  ValidityMask *mask;
  unsigned_long *puVar1;
  idx_t i;
  Allocator *pAVar2;
  long lVar3;
  idx_t iVar4;
  primitive_dictionary_entry_t *ppVar5;
  InternalException *this_00;
  idx_t r;
  idx_t iVar6;
  long *plVar7;
  data_ptr_t pdVar8;
  undefined8 uVar9;
  WriteStream *ser;
  string_t *value;
  StringStatisticsState *string_stats;
  string_t target_value;
  uint32_t value_index;
  anon_union_16_2_67f50693_for_value local_60;
  anon_union_16_2_67f50693_for_value local_50;
  undefined1 local_40 [16];
  
  ser = (WriteStream *)chunk_start;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01d0b9f6_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Unknown encoding","");
    InternalException::InternalException(this_00,(string *)&local_50.pointer);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  mask = &input_column->validity;
  pdVar8 = input_column->data;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,true>
                (input_column,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetStringOperator,false>
              (input_column,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01d0b9f6_caseD_1;
  case 5:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar4, (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
          local_60._0_8_ = *(undefined8 *)(pdVar8 + iVar6 * 0x10);
          local_60.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + iVar6 * 0x10 + 8);
          local_50._0_8_ = local_60._0_8_;
          local_50.pointer.ptr = local_60.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_50.pointer);
          DbpEncoder::BeginWrite<duckdb::string_t>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(string_t *)&local_60.pointer);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          iVar6 = iVar6 + 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      pdVar8 = pdVar8 + iVar6 * 0x10 + 8;
      do {
        local_60._0_8_ = *(undefined8 *)(pdVar8 + -8);
        local_60.pointer.ptr = (char *)*(undefined8 *)pdVar8;
        local_50._0_8_ = local_60._0_8_;
        local_50.pointer.ptr = local_60.pointer.ptr;
        StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_50.pointer);
        DbpEncoder::WriteValue<duckdb::string_t>
                  ((DbpEncoder *)(page_state_p + 2),temp_writer,(string_t *)&local_60.pointer);
        pdVar8 = pdVar8 + 0x10;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 6:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar4, (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
          local_60._0_8_ = *(undefined8 *)(pdVar8 + iVar6 * 0x10);
          local_60.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + iVar6 * 0x10 + 8);
          local_50._0_8_ = local_60._0_8_;
          local_50.pointer.ptr = local_60.pointer.ptr;
          StringStatisticsState::Update
                    ((StringStatisticsState *)stats,(string_t *)&local_50.pointer);
          pAVar2 = BufferAllocator::Get
                             (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<duckdb::string_t>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar2,temp_writer,
                     (string_t *)&local_60.pointer);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          iVar6 = iVar6 + 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      plVar7 = (long *)(pdVar8 + iVar6 * 0x10 + 8);
      do {
        local_60._0_8_ = plVar7[-1];
        local_60.pointer.ptr = (char *)*plVar7;
        local_50._0_8_ = local_60._0_8_;
        local_50.pointer.ptr = local_60.pointer.ptr;
        StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_50.pointer);
        local_50._0_8_ = local_60._0_8_ & 0xffffffff;
        DbpEncoder::WriteValueInternal
                  ((DbpEncoder *)(page_state_p + 0x909),temp_writer,(int64_t *)&local_50);
        uVar9 = local_60.pointer.prefix;
        if (0xc < (local_60._0_8_ & 0xffffffff)) {
          uVar9 = local_60.pointer.ptr;
        }
        (**(code **)*page_state_p[0x1213]._vptr_ColumnWriterPageState)
                  (page_state_p[0x1213]._vptr_ColumnWriterPageState,uVar9);
        plVar7 = plVar7 + 2;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 8:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar4 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar4, (puVar1[iVar4 >> 6] >> (iVar4 & 0x3f) & 1) != 0)) {
          local_50.pointer.length._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_50,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          break;
        }
        iVar4 = iVar4 + 1;
        iVar6 = chunk_end;
      } while (chunk_end != iVar4);
    }
    lVar3 = chunk_end - iVar6;
    if (iVar6 <= chunk_end && lVar3 != 0) {
      value = (string_t *)(pdVar8 + iVar6 * 0x10);
      do {
        ppVar5 = PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                 ::Lookup((PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
                           *)page_state_p[0x121b]._vptr_ColumnWriterPageState,value);
        local_50.pointer.length = ppVar5->index;
        RleBpEncoder::WriteValue
                  ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_50);
        value = value + 1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar2 = BufferAllocator::Get
                         (((this->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar2);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        local_60._0_8_ = *(undefined8 *)(pdVar8 + chunk_start * 0x10);
        local_60.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + chunk_start * 0x10 + 8);
        local_50._0_8_ = local_60._0_8_;
        local_50.pointer.ptr = local_60.pointer.ptr;
        StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_50.pointer);
        lVar3 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar3 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)&local_60 + lVar3);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}